

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::SumPropagateStats
          (duckdb *this,ClientContext *context,BoundAggregateExpression *expr,
          AggregateStatisticsInput *input)

{
  optional_ptr<duckdb::NodeStatistics,_true> *this_00;
  PhysicalType type;
  bool bVar1;
  int32_t iVar2;
  reference stats;
  int64_t iVar3;
  InternalException *this_01;
  hugeint_t max_sum_negative;
  hugeint_t max_positive;
  hugeint_t max_negative;
  hugeint_t max_sum_positive;
  hugeint_t local_1b8;
  hugeint_t local_1a8;
  hugeint_t local_198;
  AggregateFunction local_180;
  hugeint_t local_50;
  hugeint_t local_40;
  
  local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function;
  if ((input->node_stats).ptr != (NodeStatistics *)0x0) {
    this_00 = &input->node_stats;
    optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
    if (this_00->ptr->has_max_cardinality == true) {
      stats = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
      bVar1 = NumericStats::HasMinMax(stats);
      if (bVar1) {
        type = (stats->type).physical_type_;
        if (type == INT64) {
          NumericStats::Min((Value *)&local_180,stats);
          iVar3 = Value::GetValueUnsafe<long>((Value *)&local_180);
          hugeint_t::hugeint_t(&local_1b8,iVar3);
          local_198.lower = local_1b8.lower;
          local_198.upper = local_1b8.upper;
          Value::~Value((Value *)&local_180);
          NumericStats::Max((Value *)&local_180,stats);
          iVar3 = Value::GetValueUnsafe<long>((Value *)&local_180);
          hugeint_t::hugeint_t(&local_1b8,iVar3);
        }
        else {
          if (type != INT32) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)((long)&local_180 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Unsupported type for propagate sum stats","");
            InternalException::InternalException(this_01,(string *)&local_180);
            __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          NumericStats::Min((Value *)&local_180,stats);
          iVar2 = Value::GetValueUnsafe<int>((Value *)&local_180);
          hugeint_t::hugeint_t(&local_1b8,(long)iVar2);
          local_198.lower = local_1b8.lower;
          local_198.upper = local_1b8.upper;
          Value::~Value((Value *)&local_180);
          NumericStats::Max((Value *)&local_180,stats);
          iVar2 = Value::GetValueUnsafe<int>((Value *)&local_180);
          hugeint_t::hugeint_t(&local_1b8,(long)iVar2);
        }
        local_1a8.lower = local_1b8.lower;
        local_1a8.upper = local_1b8.upper;
        Value::~Value((Value *)&local_180);
        optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
        local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function._0_16_ =
             Hugeint::Convert<unsigned_long>(this_00->ptr->max_cardinality);
        local_1b8 = hugeint_t::operator*(&local_198,(hugeint_t *)&local_180);
        optional_ptr<duckdb::NodeStatistics,_true>::CheckValid(this_00);
        local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function._0_16_ =
             Hugeint::Convert<unsigned_long>(this_00->ptr->max_cardinality);
        local_40 = hugeint_t::operator*(&local_1a8,(hugeint_t *)&local_180);
        hugeint_t::hugeint_t((hugeint_t *)&local_180,0x7fffffffffffffff);
        bVar1 = hugeint_t::operator>=(&local_40,(hugeint_t *)&local_180);
        if (!bVar1) {
          hugeint_t::hugeint_t(&local_50,-0x8000000000000000);
          bVar1 = hugeint_t::operator<=(&local_1b8,&local_50);
          if (!bVar1) {
            GetSumAggregateNoOverflow(&local_180,type);
            AggregateFunction::operator=(&expr->function,&local_180);
            local_180.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
                 (_func_int **)&PTR__AggregateFunction_01996688;
            if (local_180.function_info.internal.
                super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_180.function_info.internal.
                         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            BaseScalarFunction::~BaseScalarFunction(&local_180.super_BaseScalarFunction);
          }
        }
      }
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> SumPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                             AggregateStatisticsInput &input) {
	if (input.node_stats && input.node_stats->has_max_cardinality) {
		auto &numeric_stats = input.child_stats[0];
		if (!NumericStats::HasMinMax(numeric_stats)) {
			return nullptr;
		}
		auto internal_type = numeric_stats.GetType().InternalType();
		hugeint_t max_negative;
		hugeint_t max_positive;
		switch (internal_type) {
		case PhysicalType::INT32:
			max_negative = NumericStats::Min(numeric_stats).GetValueUnsafe<int32_t>();
			max_positive = NumericStats::Max(numeric_stats).GetValueUnsafe<int32_t>();
			break;
		case PhysicalType::INT64:
			max_negative = NumericStats::Min(numeric_stats).GetValueUnsafe<int64_t>();
			max_positive = NumericStats::Max(numeric_stats).GetValueUnsafe<int64_t>();
			break;
		default:
			throw InternalException("Unsupported type for propagate sum stats");
		}
		auto max_sum_negative = max_negative * Hugeint::Convert(input.node_stats->max_cardinality);
		auto max_sum_positive = max_positive * Hugeint::Convert(input.node_stats->max_cardinality);
		if (max_sum_positive >= NumericLimits<int64_t>::Maximum() ||
		    max_sum_negative <= NumericLimits<int64_t>::Minimum()) {
			// sum can potentially exceed int64_t bounds: use hugeint sum
			return nullptr;
		}
		// total sum is guaranteed to fit in a single int64: use int64 sum instead of hugeint sum
		expr.function = GetSumAggregateNoOverflow(internal_type);
	}
	return nullptr;
}